

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get_value<tinyusdz::value::texcoord2h>(Attribute *this,texcoord2h *v)

{
  value_type *pvVar1;
  optional<tinyusdz::value::texcoord2h> local_2c;
  optional<tinyusdz::value::texcoord2h> local_26;
  texcoord2h *ptStack_20;
  optional<tinyusdz::value::texcoord2h> ret;
  texcoord2h *v_local;
  Attribute *this_local;
  
  if (v == (texcoord2h *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    ptStack_20 = v;
    primvar::PrimVar::get_value<tinyusdz::value::texcoord2h>(&local_2c,&this->_var);
    nonstd::optional_lite::optional<tinyusdz::value::texcoord2h>::
    optional<tinyusdz::value::texcoord2h,_0>(&local_26,&local_2c);
    nonstd::optional_lite::optional<tinyusdz::value::texcoord2h>::~optional(&local_2c);
    this_local._7_1_ = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_26)
    ;
    if (this_local._7_1_) {
      pvVar1 = nonstd::optional_lite::optional<tinyusdz::value::texcoord2h>::value(&local_26);
      *ptStack_20 = *pvVar1;
    }
    nonstd::optional_lite::optional<tinyusdz::value::texcoord2h>::~optional(&local_26);
  }
  return this_local._7_1_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }